

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

WeakArenaReference<Js::IDiagObjectModelDisplay> * __thiscall
Js::ResolvedObject::GetObjectDisplay(ResolvedObject *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *alloc;
  WeakArenaReference<Js::IDiagObjectModelDisplay> *this_00;
  ThreadContext *this_01;
  DebugManager *this_02;
  ReferencedArenaAdapter *_adapter;
  IDiagObjectModelDisplay *local_80;
  TrackAllocData local_40;
  IDiagObjectModelDisplay *local_18;
  IDiagObjectModelDisplay *pOMDisplay;
  ResolvedObject *this_local;
  
  pOMDisplay = (IDiagObjectModelDisplay *)this;
  if (this->typeId == TypeIds_HostDispatch) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x3d,"(typeId != TypeIds_HostDispatch)",
                                "Bad usage of ResolvedObject::GetObjectDisplay");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->objectDisplay == (IDiagObjectModelDisplay *)0x0) {
    local_80 = CreateDisplay(this);
  }
  else {
    local_80 = this->objectDisplay;
  }
  local_18 = local_80;
  if (local_80 == (IDiagObjectModelDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x40,"(pOMDisplay)","pOMDisplay");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,
             (type_info *)&Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
             ,0x42);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
  this_00 = (WeakArenaReference<Js::IDiagObjectModelDisplay> *)
            new<Memory::HeapAllocator>(0x10,alloc,0x350bd0);
  this_01 = ScriptContext::GetThreadContext(this->scriptContext);
  this_02 = ThreadContext::GetDebugManager(this_01);
  _adapter = DebugManager::GetDiagnosticArena(this_02);
  Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::WeakArenaReference
            (this_00,_adapter,local_18);
  return this_00;
}

Assistant:

WeakArenaReference<IDiagObjectModelDisplay>* ResolvedObject::GetObjectDisplay()
    {
        AssertMsg(typeId != TypeIds_HostDispatch, "Bad usage of ResolvedObject::GetObjectDisplay");

        IDiagObjectModelDisplay* pOMDisplay = (this->objectDisplay != nullptr) ? this->objectDisplay : CreateDisplay();
        Assert(pOMDisplay);

        return HeapNew(WeakArenaReference<IDiagObjectModelDisplay>, scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena(), pOMDisplay);
    }